

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O1

int __thiscall ThreadPool::remove(ThreadPool *this,char *__filename)

{
  int iVar1;
  char *local_18;
  
  local_18 = __filename;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->_taskInfo);
  if (iVar1 == 0) {
    std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::remove
              (&this->_task,(char *)&local_18);
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->_taskInfo);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ThreadPool::remove( AbstractTaskProvider * provider )
{
    _taskInfo.lock();

    _task.remove( provider );

    _taskInfo.unlock();
}